

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

String * __thiscall
kj::encodeBase64(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> input,
                bool breakLines)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *code_out;
  uchar *plaintext_in;
  size_t local_b0;
  Fault local_a8;
  Fault f;
  unsigned_long *local_98;
  undefined1 local_90 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  base64_encodestate s;
  size_t total;
  int cnt;
  char *c;
  ulong uStack_30;
  uint lineCount;
  size_t numChars;
  undefined1 auStack_20 [7];
  bool breakLines_local;
  ArrayPtr<const_unsigned_char> input_local;
  String *output;
  
  input_local.ptr = input.ptr;
  bVar2 = (bool)((byte)input.size_ & 1);
  _auStack_20 = this;
  input_local.size_ = (size_t)__return_storage_ptr__;
  sVar4 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_20);
  uStack_30 = ((sVar4 + 2) / 3) * 4;
  if (((undefined1  [16])input & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_30;
    c._4_4_ = SUB164(auVar1 / ZEXT816(0x48),0);
    if (uStack_30 % 0x48 != 0) {
      c._4_4_ = c._4_4_ + 1;
    }
    uStack_30 = uStack_30 + c._4_4_;
  }
  heapString(__return_storage_ptr__,uStack_30);
  code_out = String::begin(__return_storage_ptr__);
  s.result = '\0';
  s._5_3_ = 0;
  s.stepcount = 0;
  anon_unknown_0::base64_init_encodestate((base64_encodestate *)&_kjCondition.field_0x24);
  plaintext_in = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)auStack_20);
  sVar4 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_20);
  iVar3 = anon_unknown_0::base64_encode_block
                    ((char *)plaintext_in,(int)sVar4,code_out,
                     (base64_encodestate *)&_kjCondition.field_0x24,bVar2);
  s._4_8_ = s._4_8_ + (long)iVar3;
  iVar3 = anon_unknown_0::base64_encode_blockend
                    (code_out + iVar3,(base64_encodestate *)&_kjCondition.field_0x24,bVar2);
  s._4_8_ = s._4_8_ + (long)iVar3;
  local_98 = (unsigned_long *)
             _::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(unsigned_long *)&s.result);
  f.exception = (Exception *)String::size(__return_storage_ptr__);
  _::DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_90,
             (DebugExpression<unsigned_long&> *)&local_98,(unsigned_long *)&f);
  bVar2 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_90);
  if (bVar2) {
    return __return_storage_ptr__;
  }
  local_b0 = String::size(__return_storage_ptr__);
  _::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,unsigned_long&,unsigned_long>
            (&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding.c++"
             ,0x351,FAILED,"total == output.size()","_kjCondition,total, output.size()",
             (DebugComparison<unsigned_long_&,_unsigned_long> *)local_90,(unsigned_long *)&s.result,
             &local_b0);
  _::Debug::Fault::fatal(&local_a8);
}

Assistant:

String encodeBase64(ArrayPtr<const byte> input, bool breakLines) {
  /* set up a destination buffer large enough to hold the encoded data */
  // equivalent to ceil(input.size() / 3) * 4
  auto numChars = (input.size() + 2) / 3 * 4;
  if (breakLines) {
    // Add space for newline characters.
    uint lineCount = numChars / CHARS_PER_LINE;
    if (numChars % CHARS_PER_LINE > 0) {
      // Partial line.
      ++lineCount;
    }
    numChars = numChars + lineCount;
  }
  auto output = heapString(numChars);
  /* keep track of our encoded position */
  char* c = output.begin();
  /* store the number of bytes encoded by a single call */
  int cnt = 0;
  size_t total = 0;
  /* we need an encoder state */
  base64_encodestate s;

  /*---------- START ENCODING ----------*/
  /* initialise the encoder state */
  base64_init_encodestate(&s);
  /* gather data from the input and send it to the output */
  cnt = base64_encode_block((const char *)input.begin(), input.size(), c, &s, breakLines);
  c += cnt;
  total += cnt;

  /* since we have encoded the entire input string, we know that
     there is no more input data; finalise the encoding */
  cnt = base64_encode_blockend(c, &s, breakLines);
  c += cnt;
  total += cnt;
  /*---------- STOP ENCODING  ----------*/

  KJ_ASSERT(total == output.size(), total, output.size());

  return output;
}